

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.c
# Opt level: O2

int wally_psbt_remove_output(wally_psbt *psbt,uint32_t index)

{
  wally_tx *tx;
  int iVar1;
  ulong uVar2;
  ulong index_00;
  
  iVar1 = -2;
  if (((psbt != (wally_psbt *)0x0) && (tx = psbt->tx, tx != (wally_tx *)0x0)) &&
     (tx->num_outputs == psbt->num_outputs)) {
    index_00 = (ulong)index;
    uVar2 = index_00;
    iVar1 = wally_tx_remove_output(tx,index_00);
    if (iVar1 == 0) {
      psbt_output_free(psbt->outputs + index_00,SUB81(uVar2,0));
      memmove(psbt->outputs + index_00,psbt->outputs + index_00 + 1,
              (~index_00 + psbt->num_outputs) * 0xd0);
      psbt->num_outputs = psbt->num_outputs - 1;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int wally_psbt_remove_output(struct wally_psbt *psbt, uint32_t index)
{
    int ret;

    if (!psbt || !psbt->tx || psbt->tx->num_outputs != psbt->num_outputs)
        ret = WALLY_EINVAL;
    else
        ret = wally_tx_remove_output(psbt->tx, index);
    if (ret == WALLY_OK) {
        psbt_output_free(&psbt->outputs[index], false);
        memmove(psbt->outputs + index, psbt->outputs + index + 1,
                (psbt->num_outputs - index - 1) * sizeof(struct wally_psbt_output));
        psbt->num_outputs -= 1;
    }
    return ret;
}